

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  ParamDictPrivate *pPVar1;
  int iVar2;
  Layer *pLVar3;
  ParamDict *pPVar4;
  byte *in_RSI;
  ParamDict *in_RDI;
  int num_input;
  ParamDict pd;
  InnerProduct_x86_avx *in_stack_00000048;
  Option *in_stack_000004d0;
  int in_stack_000004d8;
  int in_stack_000004dc;
  Mat *in_stack_000004e0;
  Mat *in_stack_000004e8;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 *puVar5;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  InnerProduct_x86_avx *in_stack_ffffffffffffffb8;
  ParamDict *in_stack_ffffffffffffffc0;
  int local_1c;
  
  pLVar3 = create_layer_cpu((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  in_RDI[0x25]._vptr_ParamDict = (_func_int **)pLVar3;
  puVar5 = &stack0xffffffffffffffc0;
  ParamDict::ParamDict(in_stack_ffffffffffffffc0);
  (**(code **)(*in_RDI[0x25]._vptr_ParamDict + 0x10))(in_RDI[0x25]._vptr_ParamDict,puVar5);
  (**(code **)(*in_RDI[0x25]._vptr_ParamDict + 0x20))(in_RDI[0x25]._vptr_ParamDict,in_RSI);
  ParamDict::~ParamDict(in_RDI);
  if (((in_RSI[0x1e] & 1) == 0) || (in_RDI[0x14]._vptr_ParamDict != (_func_int **)0x1)) {
    iVar2 = cpu_support_x86_f16c();
    if ((iVar2 == 0) || ((in_RSI[0x22] & 1) == 0)) {
      innerproduct_transform_kernel_sse
                (in_stack_000004e8,in_stack_000004e0,in_stack_000004dc,in_stack_000004d8,
                 in_stack_000004d0);
      if ((*in_RSI & 1) != 0) {
        pPVar4 = in_RDI + 0x13;
        if (in_RDI[0x13].d != (ParamDictPrivate *)0x0) {
          pPVar1 = in_RDI[0x13].d;
          LOCK();
          iVar2 = pPVar1->params[0].type;
          pPVar1->params[0].type = pPVar1->params[0].type + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (in_RDI[0x15]._vptr_ParamDict == (_func_int **)0x0) {
              if (pPVar4->_vptr_ParamDict != (_func_int **)0x0) {
                free(pPVar4->_vptr_ParamDict);
              }
            }
            else {
              (**(code **)(*in_RDI[0x15]._vptr_ParamDict + 0x18))
                        (in_RDI[0x15]._vptr_ParamDict,pPVar4->_vptr_ParamDict);
            }
          }
        }
        pPVar4->_vptr_ParamDict = (_func_int **)0x0;
        in_RDI[0x14]._vptr_ParamDict = (_func_int **)0x0;
        *(undefined4 *)&in_RDI[0x14].d = 0;
        *(undefined4 *)&in_RDI[0x15].d = 0;
        *(undefined4 *)((long)&in_RDI[0x15].d + 4) = 0;
        *(undefined4 *)&in_RDI[0x16]._vptr_ParamDict = 0;
        *(undefined4 *)((long)&in_RDI[0x16]._vptr_ParamDict + 4) = 0;
        *(undefined4 *)&in_RDI[0x16].d = 0;
        in_RDI[0x17]._vptr_ParamDict = (_func_int **)0x0;
        in_RDI[0x13].d = (ParamDictPrivate *)0x0;
      }
      local_1c = 0;
    }
    else {
      local_1c = create_pipeline_fp16s
                           (in_stack_ffffffffffffffb8,
                            (Option *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
      ;
    }
  }
  else {
    local_1c = create_pipeline_int8_x86(in_stack_00000048,(Option *)this);
  }
  return local_1c;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}